

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O1

idx_t __thiscall
duckdb::BufferPool::PurgeAgedBlocksInternal
          (BufferPool *this,EvictionQueue *queue,uint32_t max_age_sec,int64_t now,int64_t limit)

{
  BufferEvictionNode *item;
  long lVar1;
  __int_type _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  BlockHandle *pBVar6;
  type this_00;
  BufferEvictionNode *lock_00;
  BlockLock lock;
  shared_ptr<duckdb::BlockHandle,_true> handle;
  BufferEvictionNode node;
  idx_t local_88;
  unique_lock<std::mutex> local_80;
  int64_t local_70;
  int64_t local_68;
  ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
  *local_60;
  undefined1 local_58 [24];
  long *plStack_40;
  __int_type local_38;
  
  local_60 = &queue->q;
  local_88 = 0;
  item = (BufferEvictionNode *)(local_58 + 0x10);
  local_70 = now;
  local_68 = limit;
  do {
    local_58._16_8_ = 0;
    plStack_40 = (long *)0x0;
    bVar3 = duckdb_moodycamel::
            ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
            ::try_dequeue<duckdb::BufferEvictionNode>(local_60,item);
    if (bVar3) {
LAB_0104ae1b:
      lock_00 = item;
      BufferEvictionNode::TryGetBlockHandle((BufferEvictionNode *)local_58);
      if ((element_type *)local_58._0_8_ == (element_type *)0x0) {
        LOCK();
        (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
             (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
        UNLOCK();
        bVar3 = false;
      }
      else {
        pBVar6 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                           ((shared_ptr<duckdb::BlockHandle,_true> *)local_58);
        local_80._M_device = &pBVar6->lock;
        local_80._M_owns = false;
        ::std::unique_lock<std::mutex>::lock(&local_80);
        local_80._M_owns = true;
        this_00 = shared_ptr<duckdb::BlockHandle,_true>::operator*
                            ((shared_ptr<duckdb::BlockHandle,_true> *)local_58);
        if (local_38 == (this_00->eviction_seq_num).super___atomic_base<unsigned_long>._M_i) {
          bVar3 = BlockHandle::CanUnload(this_00);
          if (!bVar3) goto LAB_0104aebe;
          pBVar6 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                             ((shared_ptr<duckdb::BlockHandle,_true> *)local_58);
          lVar1 = (pBVar6->lru_timestamp_msec).super___atomic_base<long>._M_i;
          bVar3 = local_68 <= lVar1;
          bVar4 = lVar1 <= local_70;
          pBVar6 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                             ((shared_ptr<duckdb::BlockHandle,_true> *)local_58);
          _Var2 = (pBVar6->memory_usage).super___atomic_base<unsigned_long>._M_i;
          pBVar6 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                             ((shared_ptr<duckdb::BlockHandle,_true> *)local_58);
          BlockHandle::Unload(pBVar6,(BlockLock *)lock_00);
          bVar3 = bVar3 && bVar4;
          local_88 = local_88 + _Var2;
        }
        else {
LAB_0104aebe:
          LOCK();
          (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
               (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
          UNLOCK();
          bVar3 = false;
        }
        ::std::unique_lock<std::mutex>::~unique_lock(&local_80);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
    }
    else {
      bVar4 = EvictionQueue::TryDequeueWithLock(queue,item);
      bVar3 = true;
      if (bVar4) goto LAB_0104ae1b;
    }
    if (plStack_40 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        lVar1 = (long)plStack_40 + 0xc;
        iVar5 = *(int *)lVar1;
        *(int *)lVar1 = *(int *)lVar1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(int *)((long)plStack_40 + 0xc);
        *(int *)((long)plStack_40 + 0xc) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (**(code **)(*plStack_40 + 0x18))();
      }
    }
    if (bVar3) {
      return local_88;
    }
  } while( true );
}

Assistant:

idx_t BufferPool::PurgeAgedBlocksInternal(EvictionQueue &queue, uint32_t max_age_sec, int64_t now, int64_t limit) {
	idx_t purged_bytes = 0;
	queue.IterateUnloadableBlocks(
	    [&](BufferEvictionNode &node, const shared_ptr<BlockHandle> &handle, BlockLock &lock) {
		    // We will unload this block regardless. But stop the iteration immediately afterward if this
		    // block is younger than the age threshold.
		    auto lru_timestamp_msec = handle->GetLRUTimestamp();
		    bool is_fresh = lru_timestamp_msec >= limit && lru_timestamp_msec <= now;
		    purged_bytes += handle->GetMemoryUsage();
		    handle->Unload(lock);
		    // Return false to stop iterating if the current block is_fresh
		    return !is_fresh;
	    });
	return purged_bytes;
}